

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSModuleDef * js_new_module_def(JSContext *ctx,JSAtom name)

{
  list_head *plVar1;
  JSModuleDef *pJVar2;
  
  pJVar2 = (JSModuleDef *)js_mallocz(ctx,0xa8);
  if (pJVar2 == (JSModuleDef *)0x0) {
    JS_FreeAtom(ctx,name);
  }
  else {
    (pJVar2->header).ref_count = 1;
    pJVar2->module_name = name;
    (pJVar2->module_ns).u.int32 = 0;
    (pJVar2->module_ns).tag = 3;
    (pJVar2->func_obj).u.int32 = 0;
    (pJVar2->func_obj).tag = 3;
    (pJVar2->eval_exception).u.int32 = 0;
    (pJVar2->eval_exception).tag = 3;
    (pJVar2->meta_obj).u.int32 = 0;
    (pJVar2->meta_obj).tag = 3;
    plVar1 = (ctx->loaded_modules).prev;
    plVar1->next = &pJVar2->link;
    (pJVar2->link).prev = plVar1;
    (pJVar2->link).next = &ctx->loaded_modules;
    (ctx->loaded_modules).prev = &pJVar2->link;
  }
  return pJVar2;
}

Assistant:

static JSModuleDef *js_new_module_def(JSContext *ctx, JSAtom name)
{
    JSModuleDef *m;
    m = js_mallocz(ctx, sizeof(*m));
    if (!m) {
        JS_FreeAtom(ctx, name);
        return NULL;
    }
    m->header.ref_count = 1;
    m->module_name = name;
    m->module_ns = JS_UNDEFINED;
    m->func_obj = JS_UNDEFINED;
    m->eval_exception = JS_UNDEFINED;
    m->meta_obj = JS_UNDEFINED;
    list_add_tail(&m->link, &ctx->loaded_modules);
    return m;
}